

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::frexp_invalid_x
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderFunction function;
  string shaderSource_00;
  string shaderSource_01;
  bool bVar1;
  char *__s;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  string shaderSource;
  DataType in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3c [12];
  _Alloc_hider _Var5;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  _Var5._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff48,"frexp: Invalid x type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != &local_a8) {
    operator_delete(_Var5._M_p,local_a8._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,__s,(allocator<char> *)&stack0xffffffffffffff47);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c82f43);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar3) {
        local_a8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_a8._8_8_ = plVar2[3];
        _Var5._M_p = (pointer)&local_a8;
      }
      else {
        local_a8._M_allocated_capacity = paVar3->_M_allocated_capacity;
        _Var5._M_p = (pointer)*plVar2;
      }
      sVar6 = plVar2[1];
      *plVar2 = (long)paVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != &local_a8) {
        operator_delete(_Var5._M_p,local_a8._M_allocated_capacity + 1);
      }
      local_58 = lVar4;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        function = *(ShaderFunction *)
                    ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar4);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceFrexpLdexp_abi_cxx11_
                  ((string *)&stack0xffffffffffffff48,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,8,function,function,
                   in_stack_ffffffffffffff38);
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char*>((string *)local_78,_Var5._M_p,_Var5._M_p + sVar6);
        shaderSource_00._4_12_ = in_stack_ffffffffffffff3c;
        shaderSource_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffff38;
        shaderSource_00.field_2._M_allocated_capacity = (size_type)_Var5._M_p;
        shaderSource_00.field_2._8_8_ = sVar6;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_78[0],shaderSource_00);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != &local_a8) {
          operator_delete(_Var5._M_p,local_a8._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceFrexpLdexp_abi_cxx11_
                  ((string *)&stack0xffffffffffffff48,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,8,
                   *(ShaderFunction *)
                    ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar4
                    ),function,in_stack_ffffffffffffff38);
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>((string *)local_98,_Var5._M_p,_Var5._M_p + sVar6);
        shaderSource_01._4_12_ = in_stack_ffffffffffffff3c;
        shaderSource_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffff38;
        shaderSource_01.field_2._M_allocated_capacity = (size_type)_Var5._M_p;
        shaderSource_01.field_2._8_8_ = sVar6;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_98[0],shaderSource_01);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != &local_a8) {
          operator_delete(_Var5._M_p,local_a8._M_allocated_capacity + 1);
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_58;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void frexp_invalid_x (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("frexp: Invalid x type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceFrexpLdexp(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_FREXP, s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceFrexpLdexp(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_FREXP, s_uintTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}